

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

_Bool prepare_ghost(chunk *c,wchar_t r_idx,monster_conflict *mon,_Bool from_savefile)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  wchar_t wVar3;
  monster_blow *pmVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  _Bool _Var11;
  uint32_t uVar12;
  int iVar13;
  monster_lore *pmVar14;
  monster_blow *pmVar15;
  long lVar16;
  monster_race *pmVar17;
  char *pcVar18;
  ang_file *f;
  size_t sVar19;
  ushort **ppuVar20;
  __int32_t **pp_Var21;
  player_race *p_race;
  player_class *class;
  ulong uVar22;
  long lVar23;
  ghost_info *pgVar24;
  char cVar25;
  monster_race *pmVar26;
  wchar_t ghost_class;
  wchar_t ghost_race;
  char buf [80];
  char path [1024];
  guid local_4ac;
  monster_conflict *local_4a8;
  guid local_49c;
  monster_race *local_498;
  monster_lore *local_490;
  char local_488 [2];
  char local_486 [78];
  char local_438 [1032];
  
  local_4ac = 0;
  pmVar26 = r_info + r_idx;
  local_4a8 = mon;
  pmVar14 = get_lore(pmVar26);
  if (c->ghost == (ghost_info *)0x0) {
    __assert_fail("c->ghost",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x2d7,"_Bool prepare_ghost(struct chunk *, int, struct monster *, _Bool)");
  }
  _Var11 = flag_has_dbg(pmVar26->flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
  if ((_Var11) && (c->depth + L'\xfffffffb' <= pmVar26->level || from_savefile)) {
    c->ghost->race = r_idx;
    local_490 = pmVar14;
    mem_free(r_info[(ulong)z_info->r_max - 1].blow);
    memcpy(r_info + ((ulong)z_info->r_max - 1),pmVar26,0xd0);
    pmVar15 = (monster_blow *)mem_alloc((ulong)z_info->mon_blows_max * 0x30);
    r_info[(ulong)z_info->r_max - 1].blow = pmVar15;
    if (z_info->mon_blows_max != 0) {
      lVar16 = 0x30;
      uVar22 = 0;
      do {
        pmVar15 = r_info[(ulong)z_info->r_max - 1].blow;
        pmVar4 = pmVar26->blow;
        puVar1 = (undefined8 *)((long)&pmVar4[-1].next + lVar16);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)pmVar4 + lVar16 + -0x20);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)pmVar4 + lVar16 + -0x10);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)pmVar15 + lVar16 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)((long)pmVar15 + lVar16 + -0x20);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        puVar1 = (undefined8 *)((long)&pmVar15[-1].next + lVar16);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        lVar23 = (long)&(r_info[(ulong)z_info->r_max - 1].blow)->next + lVar16;
        if ((int)(z_info->mon_blows_max - 1) <= (int)uVar22) {
          lVar23 = 0;
        }
        *(long *)((long)&r_info[(ulong)z_info->r_max - 1].blow[-1].next + lVar16) = lVar23;
        uVar22 = uVar22 + 1;
        lVar16 = lVar16 + 0x30;
      } while (uVar22 < z_info->mon_blows_max);
    }
    pmVar26 = r_info;
    uVar22 = (ulong)z_info->r_max;
    local_498 = r_info + uVar22;
    pmVar17 = r_info + (uVar22 - 1);
    local_4a8->race = pmVar17;
    pmVar26[uVar22 - 1].rarity = L'\0';
    cVar25 = '(';
    local_4a8 = (monster_conflict *)pmVar17;
    do {
      if (cVar25 == '(') {
        pgVar24 = c->ghost;
        wVar3 = pgVar24->bones_selector;
        uVar22 = (ulong)(uint)wVar3;
        if (wVar3 == L'\0') {
          uVar22 = (ulong)(uint)(int)player->depth;
          pgVar24->bones_selector = (int)player->depth;
        }
        else if ((char)wVar3 < '\0') {
          uVar22 = (ulong)(uint)(wVar3 & 0x7fU);
          pgVar24->bones_selector = wVar3 & 0x7fU;
          goto LAB_0017bd2a;
        }
LAB_0017bd70:
        pcVar10 = ANGBAND_DIR_BONE;
        pcVar18 = format("bone.%03d",uVar22);
        path_build(local_438,0x400,pcVar10,pcVar18);
      }
      else {
        uVar12 = Rand_div(z_info->max_depth - 1);
        c->ghost->bones_selector = uVar12 + L'\x01';
        uVar12 = Rand_div(3);
        uVar22 = (ulong)(uint)c->ghost->bones_selector;
        if (uVar12 != 0) goto LAB_0017bd70;
LAB_0017bd2a:
        pcVar10 = ANGBAND_DIR_GHOST;
        pcVar18 = format("bone.%03d",uVar22);
        path_build(local_438,0x400,pcVar10,pcVar18);
        c->ghost->bones_selector = c->ghost->bones_selector | 0x80;
      }
      if (local_438[0] != '\0') {
        f = file_open(local_438,MODE_READ,FTYPE_TEXT);
        if (f != (ang_file *)0x0) {
          _Var11 = file_getl(f,local_488,0x50);
          if (!_Var11) {
            return false;
          }
          my_strcpy(c->ghost->name,local_488,0xf);
          _Var11 = file_getl(f,local_488,0x50);
          if (!_Var11) {
            return false;
          }
          iVar13 = __isoc99_sscanf(local_488,"%d",&local_49c);
          if (iVar13 != 1) {
            return false;
          }
          _Var11 = file_getl(f,local_488,0x50);
          if (!_Var11) {
            return false;
          }
          iVar13 = __isoc99_sscanf(local_488,"%d",&local_4ac);
          if (iVar13 != 1) {
            return false;
          }
          _Var11 = file_getl(f,local_488,0x50);
          if ((_Var11) &&
             (iVar13 = __isoc99_sscanf(local_488,"%d",&c->ghost->string_type), iVar13 != 1)) {
            c->ghost->string_type = L'\0';
          }
          sVar19 = strlen(local_488);
          if (sVar19 < 3) {
            c->ghost->string_type = L'\0';
          }
          else {
            my_strcpy(c->ghost->string,local_486,sVar19);
          }
          file_close(f);
          uVar22 = 0;
          goto LAB_0017bf24;
        }
        c->ghost->bones_selector = L'\0';
      }
      cVar25 = cVar25 + -1;
    } while (cVar25 != '\0');
  }
  return false;
  while (uVar22 = uVar22 + 1, uVar22 != 0x10) {
LAB_0017bf24:
    cVar25 = c->ghost->name[uVar22];
    if ((cVar25 == '\0') || (cVar25 == ',')) goto LAB_0017bf40;
  }
  uVar22 = 0x10;
LAB_0017bf40:
  c->ghost->name[uVar22 & 0xff] = '\0';
  pgVar24 = c->ghost;
  cVar25 = pgVar24->name[0];
  if (cVar25 == '\0') {
    sVar19 = strlen(pgVar24->name);
    my_strcpy(pgVar24->name,"Nobody",sVar19);
    pgVar24 = c->ghost;
    cVar25 = pgVar24->name[0];
  }
  ppuVar20 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar20 + (long)cVar25 * 2 + 1) & 2) != 0) {
    pp_Var21 = __ctype_toupper_loc();
    pgVar24->name[0] = (char)(*pp_Var21)[cVar25];
  }
  p_race = player_id2race(local_49c);
  class = player_id2class(local_4ac);
  process_ghost_race_class(p_race,class,(monster_race *)local_4a8);
  if (L'K' < c->depth) {
    local_498[-1].spell_power = local_498[-1].spell_power + ((uint)(c->depth * 3 - 0xe1U) >> 1);
  }
  uVar12 = 0xffffffff;
  if (c->mon_rating < 0xfffffff6) {
    uVar12 = c->mon_rating + 10;
  }
  c->mon_rating = uVar12;
  local_490->sights = 1;
  return true;
}

Assistant:

bool prepare_ghost(struct chunk *c, int r_idx, struct monster *mon,
				   bool from_savefile)
{
	int ghost_race, ghost_class = 0;
	uint8_t try, i;
	uint16_t iblow;

	struct monster_race *race = &r_info[r_idx];
	struct monster_lore *lore = get_lore(race);
	struct player_race *p_race;
	struct player_class *class;

	ang_file *fp = NULL;
	char path[1024];
	char buf[80];

	/* Paranoia. */
	assert(c->ghost);
	if (!rf_has(race->flags, RF_PLAYER_GHOST))
		return false;

	/* Hack -- No easy player ghosts, unless the ghost is from a savefile.
	 * This also makes player ghosts much rarer, and effectively (almost)
	 * prevents more than one from being on a level. From 0.5.1, other code
	 * makes it is formally impossible to have more than one ghost at a time.
	 * -BR- */
	if ((race->level < c->depth - 5) && (from_savefile == false))
		return false;

	/* Store the index of the base race. */
	c->ghost->race = r_idx;

	/* Copy the info from the template to the special "ghost slot", and use
	 * that from here on.  Melee blows have to be deeply copied so those of
	 * the base race are not modified. */
	mem_free(r_info[PLAYER_GHOST_RACE].blow);
	memcpy(&r_info[PLAYER_GHOST_RACE], race, sizeof(*race));
	r_info[PLAYER_GHOST_RACE].blow = mem_alloc(z_info->mon_blows_max
		* sizeof(*r_info[PLAYER_GHOST_RACE].blow));
	for (iblow = 0; iblow < z_info->mon_blows_max; ++iblow) {
		r_info[PLAYER_GHOST_RACE].blow[iblow] = race->blow[iblow];
		r_info[PLAYER_GHOST_RACE].blow[iblow].next =
			(iblow < z_info->mon_blows_max - 1) ?
			r_info[PLAYER_GHOST_RACE].blow + iblow + 1 : NULL;
	}
	race = &r_info[PLAYER_GHOST_RACE];
	mon->race = race;

	/* Set rarity to 0 so the ghost can't rise again */
	race->rarity = 0;

	/* Choose a bones file.  Use the variable bones_selector if it has any
	 * information in it (this allows saved ghosts to reacquire all special
	 * features), then use the current depth, and finally pick at random.
	 *
	 * Note the hackery with bitflags to choose between a genuine player
	 * ghost and a preloaded one, and the chance that a ghost will be
	 * different on reloading on a multiplayer server if someone else has
	 * killed the original one in the mean time. */
	for (try = 0; try < 40; ++try) {
		/* Prepare a path, and store the file number for future reference. */
		if (try == 0) {
			if (!c->ghost->bones_selector) {
				/* Try for an actual ghost of the player's depth first */
				c->ghost->bones_selector = player->depth;
				path_build(path, sizeof(path), ANGBAND_DIR_BONE,
						   format("bone.%03d", c->ghost->bones_selector));
			} else {
				/* Loading a preloaded ghost from savefile */
				if (c->ghost->bones_selector & 0x80) {
					c->ghost->bones_selector &= 0x7F;
					path_build(path, sizeof(path), ANGBAND_DIR_GHOST,
							   format("bone.%03d", c->ghost->bones_selector));
					c->ghost->bones_selector |= 0x80;
				} else {
					/* Loading an actual ghost from savefile */
					path_build(path, sizeof(path), ANGBAND_DIR_BONE,
							   format("bone.%03d", c->ghost->bones_selector));
				}
			}
		} else {
			/* Just pick a random depth if we can't get the player's */
			c->ghost->bones_selector = randint1(z_info->max_depth - 1);

			/* After the first attempt, randomly try preloaded ghosts */
			if (!one_in_(3)) {
				path_build(path, sizeof(path), ANGBAND_DIR_BONE,
						   format("bone.%03d", c->ghost->bones_selector));
			} else {
				path_build(path, sizeof(path), ANGBAND_DIR_GHOST,
						   format("bone.%03d", c->ghost->bones_selector));
				c->ghost->bones_selector |= 0x80;
			}
		}

		/* Check we actually have a path */
		if (strlen(path) == 0) continue;

		/* Attempt to open the bones file. */
		fp = file_open(path, MODE_READ, FTYPE_TEXT);

		/* No bones file with that number, try again. */
		if (!fp) {
			c->ghost->bones_selector = 0;
			continue;
		}

		/* Success. */
		if (fp) break;
	}

	/* No bones file found, so no Ghost is made. */
	if (!fp) return false;

	/* Scan the file */

	/* Name */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	my_strcpy(c->ghost->name, buf, GHOST_NAME_LENGTH);

	/* Race */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	if (1 != sscanf(buf, "%d", &ghost_race)) return false;

	/* Class */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	if (1 != sscanf(buf, "%d", &ghost_class)) return false;

	/* String type (maybe) */
	if (file_getl(fp, buf, sizeof(buf))) {
		if (1 != sscanf(buf, "%d", &c->ghost->string_type))
			c->ghost->string_type = 0;
	}

	/* String (maybe) */
	if (strlen(buf) > 2) {
		my_strcpy(c->ghost->string, buf + 2, strlen(buf));
	} else {
		c->ghost->string_type = 0;
	}

	/* Close the file */
	file_close(fp);

	/* Process the ghost name and store it. */
	for (i = 0; (i < 16) && (c->ghost->name[i]) &&
			 (c->ghost->name[i] != ','); i++);

	/* Terminate the name */
	c->ghost->name[i] = '\0';

	/* Force a name */
	if (!c->ghost->name[0]) {
		my_strcpy(c->ghost->name, "Nobody", strlen(c->ghost->name));
	}

	/* Capitalize the name */
	if (islower(c->ghost->name[0])) {
		c->ghost->name[0] = toupper(c->ghost->name[0]);
	}

	/* Process race and class. */
	p_race = player_id2race(ghost_race);
	class = player_id2class(ghost_class);
	process_ghost_race_class(p_race, class, race);

	/* A little extra help for the deepest ghosts */
	if (c->depth > 75) {
		race->spell_power += 3 * (c->depth - 75) / 2;
	}

	/* Increase the level feeling */
	add_to_monster_rating(c, 10);

	/* Player ghosts are "seen" whenever generated. */
	lore->sights = 1;

	/* Success */
	return true;
}